

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool __thiscall
basist::basisu_lowlevel_uastc_transcoder::transcode_slice
          (basisu_lowlevel_uastc_transcoder *this,void *pDst_blocks,uint32_t num_blocks_x,
          uint32_t num_blocks_y,uint8_t *pImage_data,uint32_t image_data_size,block_format fmt,
          uint32_t output_block_or_pixel_stride_in_bytes,bool bc1_allow_threecolor_blocks,
          bool has_alpha,uint32_t orig_width,uint32_t orig_height,
          uint32_t output_row_pitch_in_blocks_or_pixels,basisu_transcoder_state *pState,
          uint32_t output_rows_in_pixels,int channel0,int channel1,uint32_t decode_flags)

{
  uastc_block *puVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint in_ECX;
  uint in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  uint in_R9D;
  block_format in_stack_00000008;
  uint in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  uint in_stack_00000028;
  int in_stack_00000030;
  uint in_stack_00000038;
  int in_stack_00000048;
  int in_stack_00000050;
  int in_stack_00000058;
  uint in_stack_00000060;
  uint16_t packed_1;
  color32 *c_2;
  uint32_t x_2;
  uint32_t y_2;
  uint32_t max_y_2;
  uint32_t max_x_2;
  uint8_t *pDst_pixels_2;
  color32 block_pixels_2 [4] [4];
  uint16_t packed;
  color32 *c_1;
  uint32_t x_1;
  uint32_t y_1;
  uint32_t max_y_1;
  uint32_t max_x_1;
  uint8_t *pDst_pixels_1;
  color32 block_pixels_1 [4] [4];
  color32 *c;
  uint32_t x;
  uint32_t y;
  uint32_t max_y;
  uint32_t max_x;
  uint8_t *pDst_pixels;
  color32 block_pixels [4] [4];
  uint32_t block_x;
  void *pDst_block;
  uint32_t block_y;
  bool status;
  bool from_alpha;
  bool high_quality;
  uastc_block *pSource_block;
  uint32_t total_expected_block_bytes;
  uint32_t total_blocks;
  anon_union_16_2_e7f8845d_for_uastc_block_0 *local_200;
  ushort local_1e2;
  anon_union_16_2_e7f8845d_for_uastc_block_0 *in_stack_fffffffffffffe30;
  uastc_block *in_stack_fffffffffffffe38;
  uastc_block *local_1b8;
  bool local_1a1;
  undefined6 in_stack_fffffffffffffe70;
  ushort in_stack_fffffffffffffe76;
  uastc_block *in_stack_fffffffffffffe78;
  uint local_180;
  uint local_17c;
  long local_170;
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_168;
  undefined1 in_stack_fffffffffffffeb7;
  uint32_t in_stack_fffffffffffffeb8;
  uint32_t in_stack_fffffffffffffebc;
  void *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  uint32_t in_stack_fffffffffffffed8;
  uint32_t in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  ushort in_stack_fffffffffffffee6;
  uint32_t chan0;
  uastc_block *in_stack_fffffffffffffee8;
  bool high_quality_00;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  long local_100;
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_f8 [4];
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_b8;
  uint local_a8;
  uint local_a4;
  long local_a0;
  uastc_block local_98 [4];
  uastc_block uStack_58;
  uint local_48;
  byte local_43;
  bool local_42;
  undefined1 local_41;
  undefined8 *local_40;
  uint local_38;
  int local_34;
  byte local_2e;
  byte local_2d;
  uint local_2c;
  undefined8 *local_28;
  uint local_20;
  uint local_1c;
  long local_18;
  bool local_1;
  
  local_2d = in_stack_00000018 & 1;
  local_2e = in_stack_00000020 & 1;
  if ((g_transcoder_initialized & 1) == 0) {
    __assert_fail("g_transcoder_initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2429,
                  "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                 );
  }
  if ((g_transcoder_initialized & 1) == 0) {
    local_1 = false;
  }
  else {
    local_34 = in_EDX * in_ECX;
    local_1b8 = in_stack_fffffffffffffe38;
    local_1e2 = in_stack_fffffffffffffee6;
    local_2c = in_R9D;
    local_28 = in_R8;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_RSI;
    if (in_stack_00000038 == 0) {
      bVar2 = basis_block_format_is_uncompressed(in_stack_00000008);
      local_1b8 = in_stack_fffffffffffffe38;
      local_1e2 = in_stack_fffffffffffffee6;
      if (bVar2) {
        in_stack_00000038 = in_stack_00000028;
      }
      else if (in_stack_00000008 == cFXT1_RGB) {
        in_stack_00000038 = in_stack_00000028 + 7 >> 3;
      }
      else {
        in_stack_00000038 = local_1c;
      }
    }
    bVar2 = basis_block_format_is_uncompressed(in_stack_00000008);
    if ((bVar2) && (in_stack_00000048 == 0)) {
      in_stack_00000048 = in_stack_00000030;
    }
    local_38 = local_34 << 4;
    if (local_2c < local_38) {
      local_1 = false;
    }
    else {
      local_40 = local_28;
      local_41 = (in_stack_00000060 & 0x20) != 0;
      local_1a1 = (local_2e & 1) != 0 && (in_stack_00000060 & 4) != 0;
      local_42 = local_1a1;
      local_43 = 0;
      if ((in_stack_00000008 == cPVRTC1_4_RGB) || (in_stack_00000008 == cPVRTC1_4_RGBA)) {
        if (in_stack_00000008 == cPVRTC1_4_RGBA) {
          transcode_uastc_to_pvrtc1_4_rgba
                    ((uastc_block *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8,
                     (bool)in_stack_fffffffffffffeb7);
        }
        else {
          transcode_uastc_to_pvrtc1_4_rgb
                    (in_stack_fffffffffffffee8,
                     (void *)CONCAT26(local_1e2,
                                      CONCAT24(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0))
                     ,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8,
                     (bool)in_stack_fffffffffffffed7,(bool)in_stack_fffffffffffffed6);
        }
      }
      else {
        for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
          uStack_58.field_0._8_8_ =
               local_18 + (ulong)(local_48 * in_stack_00000038 * in_stack_00000010);
          for (uStack_58.field_0.m_dwords[1] = 0; uStack_58.field_0.m_dwords[1] < local_1c;
              uStack_58.field_0.m_dwords[1] = uStack_58.field_0.m_dwords[1] + 1) {
            bVar2 = SUB41(in_stack_fffffffffffffedc >> 0x18,0);
            high_quality_00 = SUB81((ulong)in_stack_fffffffffffffee8 >> 0x38,0);
            chan0 = (uint32_t)in_stack_fffffffffffffee8;
            switch(in_stack_00000008) {
            case cETC1:
              if ((local_42 & 1U) == 0) {
                local_43 = transcode_uastc_to_etc1
                                     ((uastc_block *)
                                      CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                      (void *)CONCAT17(in_stack_fffffffffffffed7,
                                                       CONCAT16(in_stack_fffffffffffffed6,
                                                                in_stack_fffffffffffffed0)));
              }
              else {
                local_43 = transcode_uastc_to_etc1((uastc_block *)pDst_pixels,_max_y,y);
              }
              break;
            case cETC2_RGBA:
              local_43 = transcode_uastc_to_etc2_rgba
                                   (in_stack_fffffffffffffee8,
                                    (void *)CONCAT26(local_1e2,
                                                     CONCAT24(in_stack_fffffffffffffee4,
                                                              in_stack_fffffffffffffee0)));
              break;
            case cBC1:
              local_43 = transcode_uastc_to_bc1
                                   ((uastc_block *)
                                    CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                                    (void *)CONCAT17(in_stack_fffffffffffffed7,
                                                     CONCAT16(in_stack_fffffffffffffed6,
                                                              in_stack_fffffffffffffed0)),
                                    (bool)in_stack_fffffffffffffecf);
              break;
            case cBC3:
              local_43 = transcode_uastc_to_bc3
                                   (in_stack_fffffffffffffee8,
                                    (void *)CONCAT26(local_1e2,
                                                     CONCAT24(in_stack_fffffffffffffee4,
                                                              in_stack_fffffffffffffee0)),bVar2);
              break;
            case cBC4:
              if (in_stack_00000050 < 0) {
                in_stack_00000050 = 0;
              }
              local_43 = transcode_uastc_to_bc4
                                   (in_stack_fffffffffffffee8,
                                    (void *)CONCAT26(local_1e2,
                                                     CONCAT24(in_stack_fffffffffffffee4,
                                                              in_stack_fffffffffffffee0)),bVar2,
                                    in_stack_fffffffffffffed8);
              break;
            case cBC5:
              if (in_stack_00000050 < 0) {
                in_stack_00000050 = 0;
              }
              if (in_stack_00000058 < 0) {
                in_stack_00000058 = 3;
              }
              local_43 = transcode_uastc_to_bc5
                                   ((uastc_block *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    (void *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0),high_quality_00,
                                    chan0,CONCAT22(local_1e2,in_stack_fffffffffffffee4));
              break;
            default:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                            ,0x2502,
                            "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                           );
            case cBC7:
            case cBC7_M5_COLOR:
              local_43 = transcode_uastc_to_bc7(local_1b8,in_stack_fffffffffffffe30);
              break;
            case cASTC_4x4:
              local_43 = transcode_uastc_to_astc
                                   (in_stack_fffffffffffffe78,
                                    (void *)CONCAT26(in_stack_fffffffffffffe76,
                                                     in_stack_fffffffffffffe70));
              break;
            case cETC2_EAC_R11:
              if (in_stack_00000050 < 0) {
                in_stack_00000050 = 0;
              }
              local_43 = transcode_uastc_to_etc2_eac_r11
                                   ((uastc_block *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    (void *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0),high_quality_00,
                                    chan0);
              break;
            case cETC2_EAC_RG11:
              if (in_stack_00000050 < 0) {
                in_stack_00000050 = 0;
              }
              if (in_stack_00000058 < 0) {
                in_stack_00000058 = 3;
              }
              local_43 = transcode_uastc_to_etc2_eac_rg11
                                   ((uastc_block *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                    (void *)CONCAT44(in_stack_fffffffffffffef4,
                                                     in_stack_fffffffffffffef0),high_quality_00,
                                    chan0,CONCAT22(local_1e2,in_stack_fffffffffffffee4));
              break;
            case cRGBA32:
              puVar1 = local_98;
              do {
                local_1b8 = puVar1;
                color32::color32((color32 *)local_1b8);
                puVar1 = (uastc_block *)((local_1b8->field_0).m_dwords + 1);
              } while ((uastc_block *)((local_1b8->field_0).m_dwords + 1) != &uStack_58);
              local_43 = unpack_uastc(in_stack_fffffffffffffe78,
                                      (color32 *)
                                      CONCAT26(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70),
                                      SUB81((ulong)in_RSI >> 0x38,0));
              if (in_stack_00000010 != 4) {
                __assert_fail("sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24b1,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              local_a0 = local_18 +
                         (ulong)(uStack_58.field_0.m_dwords[1] * 4 +
                                local_48 * 4 * in_stack_00000038) * 4;
              local_a4 = basisu::minimum<int>
                                   (4,in_stack_00000038 + uStack_58.field_0.m_dwords[1] * -4);
              local_a8 = basisu::minimum<int>(4,in_stack_00000048 + local_48 * -4);
              for (local_b8.m_dwords[3] = 0; local_b8.m_dwords[3] < local_a8;
                  local_b8.m_dwords[3] = local_b8.m_dwords[3] + 1) {
                for (local_b8.m_dwords[2] = 0; local_b8.m_dwords[2] < local_a4;
                    local_b8.m_dwords[2] = local_b8.m_dwords[2] + 1) {
                  local_b8._0_8_ =
                       (long)&local_98[local_b8.m_dwords[3]].field_0 +
                       (ulong)local_b8.m_dwords[2] * 4;
                  *(undefined1 *)(local_a0 + (ulong)(local_b8.m_dwords[2] << 2)) =
                       *(undefined1 *)local_b8._0_8_;
                  *(undefined1 *)(local_a0 + (ulong)(local_b8.m_dwords[2] * 4 + 1)) =
                       *(undefined1 *)(local_b8._0_8_ + 1);
                  *(undefined1 *)(local_a0 + (ulong)(local_b8.m_dwords[2] * 4 + 2)) =
                       *(undefined1 *)(local_b8._0_8_ + 2);
                  *(undefined1 *)(local_a0 + (ulong)(local_b8.m_dwords[2] * 4 + 3)) =
                       *(undefined1 *)(local_b8._0_8_ + 3);
                }
                local_a0 = (ulong)in_stack_00000038 * 4 + local_a0;
              }
              break;
            case cRGB565:
            case cBGR565:
              in_stack_fffffffffffffe30 = local_f8;
              do {
                color32::color32((color32 *)in_stack_fffffffffffffe30->m_dwords);
                in_stack_fffffffffffffe30 =
                     (anon_union_16_2_e7f8845d_for_uastc_block_0 *)
                     ((long)in_stack_fffffffffffffe30 + 4);
              } while (in_stack_fffffffffffffe30 != &local_b8);
              local_43 = unpack_uastc(in_stack_fffffffffffffe78,
                                      (color32 *)
                                      CONCAT26(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70),
                                      SUB81((ulong)in_RSI >> 0x38,0));
              if (in_stack_00000010 != 2) {
                __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24ce,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              local_100 = local_18 +
                          (ulong)(uStack_58.field_0.m_dwords[1] * 4 +
                                 local_48 * 4 * in_stack_00000038) * 2;
              in_stack_fffffffffffffefc =
                   basisu::minimum<int>(4,in_stack_00000038 + uStack_58.field_0.m_dwords[1] * -4);
              in_stack_fffffffffffffef8 = basisu::minimum<int>(4,in_stack_00000048 + local_48 * -4);
              for (in_stack_fffffffffffffef4 = 0;
                  in_stack_fffffffffffffef4 < in_stack_fffffffffffffef8;
                  in_stack_fffffffffffffef4 = in_stack_fffffffffffffef4 + 1) {
                for (in_stack_fffffffffffffef0 = 0;
                    in_stack_fffffffffffffef0 < in_stack_fffffffffffffefc;
                    in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 + 1) {
                  in_stack_fffffffffffffee8 =
                       (uastc_block *)
                       ((long)(local_f8 + in_stack_fffffffffffffef4) +
                       (ulong)in_stack_fffffffffffffef0 * 4);
                  if (in_stack_00000008 == cRGB565) {
                    bVar3 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[0],0x1f);
                    bVar4 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[1],0x3f);
                    bVar5 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[2],0x1f);
                    local_1e2 = (ushort)bVar3 << 0xb | (ushort)bVar4 << 5 | (ushort)bVar5;
                  }
                  else {
                    bVar3 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[2],0x1f);
                    bVar4 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[1],0x3f);
                    bVar5 = mul_8((uint)(in_stack_fffffffffffffee8->field_0).m_bytes[0],0x1f);
                    local_1e2 = (ushort)bVar3 << 0xb | (ushort)bVar4 << 5 | (ushort)bVar5;
                  }
                  *(char *)(local_100 + (ulong)(in_stack_fffffffffffffef0 << 1)) = (char)local_1e2;
                  *(char *)(local_100 + (ulong)(in_stack_fffffffffffffef0 * 2 + 1)) =
                       (char)(local_1e2 >> 8);
                }
                local_100 = (ulong)in_stack_00000038 * 2 + local_100;
              }
              break;
            case cRGBA4444:
              local_200 = &local_168;
              do {
                color32::color32((color32 *)local_200->m_dwords);
                local_200 = (anon_union_16_2_e7f8845d_for_uastc_block_0 *)((long)local_200 + 4);
              } while (local_200 !=
                       (anon_union_16_2_e7f8845d_for_uastc_block_0 *)&stack0xfffffffffffffed8);
              local_43 = unpack_uastc(in_stack_fffffffffffffe78,
                                      (color32 *)
                                      CONCAT26(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70),
                                      SUB81((ulong)in_RSI >> 0x38,0));
              if (in_stack_00000010 != 2) {
                __assert_fail("sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                              ,0x24eb,
                              "bool basist::basisu_lowlevel_uastc_transcoder::transcode_slice(void *, uint32_t, uint32_t, const uint8_t *, uint32_t, block_format, uint32_t, bool, bool, const uint32_t, const uint32_t, uint32_t, basisu_transcoder_state *, uint32_t, int, int, uint32_t)"
                             );
              }
              local_170 = local_18 +
                          (ulong)(uStack_58.field_0.m_dwords[1] * 4 +
                                 local_48 * 4 * in_stack_00000038) * 2;
              uVar6 = basisu::minimum<int>(4,in_stack_00000038 + uStack_58.field_0.m_dwords[1] * -4)
              ;
              uVar7 = basisu::minimum<int>(4,in_stack_00000048 + local_48 * -4);
              for (local_17c = 0; local_17c < uVar7; local_17c = local_17c + 1) {
                for (local_180 = 0; local_180 < uVar6; local_180 = local_180 + 1) {
                  in_stack_fffffffffffffe78 =
                       (uastc_block *)((long)(&local_168 + local_17c) + (ulong)local_180 * 4);
                  bVar3 = mul_8((uint)(in_stack_fffffffffffffe78->field_0).m_bytes[0],0xf);
                  bVar4 = mul_8((uint)(in_stack_fffffffffffffe78->field_0).m_bytes[1],0xf);
                  bVar5 = mul_8((uint)(in_stack_fffffffffffffe78->field_0).m_bytes[2],0xf);
                  uVar8 = (uint)bVar3 << 0xc | (uint)bVar4 << 8 | (uint)bVar5 << 4;
                  bVar3 = mul_8((uint)(in_stack_fffffffffffffe78->field_0).m_bytes[3],0xf);
                  in_stack_fffffffffffffe76 = (ushort)uVar8 | (ushort)bVar3;
                  *(char *)(local_170 + (ulong)(local_180 << 1)) = (char)in_stack_fffffffffffffe76;
                  *(char *)(local_170 + (ulong)(local_180 * 2 + 1)) = (char)(uVar8 >> 8);
                }
                local_170 = (ulong)in_stack_00000038 * 2 + local_170;
              }
              break;
            case cUASTC_4x4:
              *(undefined8 *)uStack_58.field_0._8_8_ = *local_40;
              *(undefined8 *)(uStack_58.field_0._8_8_ + 8) = local_40[1];
              local_43 = 1;
            }
            if ((local_43 & 1) == 0) {
              return false;
            }
            local_40 = local_40 + 2;
            uStack_58.field_0._8_8_ = uStack_58.field_0._8_8_ + (ulong)in_stack_00000010;
          }
        }
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool basisu_lowlevel_uastc_transcoder::transcode_slice(void* pDst_blocks, uint32_t num_blocks_x, uint32_t num_blocks_y, const uint8_t* pImage_data, uint32_t image_data_size, block_format fmt,
        uint32_t output_block_or_pixel_stride_in_bytes, bool bc1_allow_threecolor_blocks, bool has_alpha, const uint32_t orig_width, const uint32_t orig_height, uint32_t output_row_pitch_in_blocks_or_pixels,
		basisu_transcoder_state* pState, uint32_t output_rows_in_pixels, int channel0, int channel1, uint32_t decode_flags)
	{
		BASISU_NOTE_UNUSED(pState);
		BASISU_NOTE_UNUSED(bc1_allow_threecolor_blocks);

		assert(g_transcoder_initialized);
		if (!g_transcoder_initialized)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder not globally initialized.\n");
			return false;
		}

#if BASISD_SUPPORT_UASTC
		const uint32_t total_blocks = num_blocks_x * num_blocks_y;

		if (!output_row_pitch_in_blocks_or_pixels)
		{
			if (basis_block_format_is_uncompressed(fmt))
				output_row_pitch_in_blocks_or_pixels = orig_width;
			else
			{
				if (fmt == block_format::cFXT1_RGB)
					output_row_pitch_in_blocks_or_pixels = (orig_width + 7) / 8;
				else
					output_row_pitch_in_blocks_or_pixels = num_blocks_x;
			}
		}

		if (basis_block_format_is_uncompressed(fmt))
		{
			if (!output_rows_in_pixels)
				output_rows_in_pixels = orig_height;
		}

		uint32_t total_expected_block_bytes = sizeof(uastc_block) * total_blocks;
		if (image_data_size < total_expected_block_bytes)
		{
			BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: image_data_size < total_expected_block_bytes The file is corrupted or this is a bug.\n");
			return false;
		}

		const uastc_block* pSource_block = reinterpret_cast<const uastc_block *>(pImage_data);

		const bool high_quality = (decode_flags & cDecodeFlagsHighQuality) != 0;
		const bool from_alpha = has_alpha && (decode_flags & cDecodeFlagsTranscodeAlphaDataToOpaqueFormats) != 0;

		bool status = false;
		if ((fmt == block_format::cPVRTC1_4_RGB) || (fmt == block_format::cPVRTC1_4_RGBA))
		{
			if (fmt == block_format::cPVRTC1_4_RGBA)
				transcode_uastc_to_pvrtc1_4_rgba((const uastc_block*)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality);
			else
				transcode_uastc_to_pvrtc1_4_rgb((const uastc_block *)pImage_data, pDst_blocks, num_blocks_x, num_blocks_y, high_quality, from_alpha);
		}
		else
		{
			for (uint32_t block_y = 0; block_y < num_blocks_y; ++block_y)
			{
				void* pDst_block = (uint8_t*)pDst_blocks + block_y * output_row_pitch_in_blocks_or_pixels * output_block_or_pixel_stride_in_bytes;
								
				for (uint32_t block_x = 0; block_x < num_blocks_x; ++block_x, ++pSource_block, pDst_block = (uint8_t *)pDst_block + output_block_or_pixel_stride_in_bytes)
				{
					switch (fmt)
					{
					case block_format::cUASTC_4x4:
					{
						memcpy(pDst_block, pSource_block, sizeof(uastc_block));
						status = true;
						break;
					}
					case block_format::cETC1:
					{
						if (from_alpha)
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block, 3);
						else
							status = transcode_uastc_to_etc1(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_RGBA:
					{
						status = transcode_uastc_to_etc2_rgba(*pSource_block, pDst_block);
						break;
					}
					case block_format::cBC1:
					{
						status = transcode_uastc_to_bc1(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC3:
					{
						status = transcode_uastc_to_bc3(*pSource_block, pDst_block, high_quality);
						break;
					}
					case block_format::cBC4:
					{
						if (channel0 < 0) 
							channel0 = 0;
						status = transcode_uastc_to_bc4(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cBC5:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_bc5(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cBC7:
					case block_format::cBC7_M5_COLOR: // for consistently with ETC1S
					{
						status = transcode_uastc_to_bc7(*pSource_block, pDst_block);
						break;
					}
					case block_format::cASTC_4x4:
					{
						status = transcode_uastc_to_astc(*pSource_block, pDst_block);
						break;
					}
					case block_format::cETC2_EAC_R11:
					{
						if (channel0 < 0)
							channel0 = 0;
						status = transcode_uastc_to_etc2_eac_r11(*pSource_block, pDst_block, high_quality, channel0);
						break;
					}
					case block_format::cETC2_EAC_RG11:
					{
						if (channel0 < 0)
							channel0 = 0;
						if (channel1 < 0)
							channel1 = 3;
						status = transcode_uastc_to_etc2_eac_rg11(*pSource_block, pDst_block, high_quality, channel0, channel1);
						break;
					}
					case block_format::cRGBA32:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32 *)block_pixels, false);

						assert(sizeof(uint32_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint32_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								pDst_pixels[0 + 4 * x] = c.r;
								pDst_pixels[1 + 4 * x] = c.g;
								pDst_pixels[2 + 4 * x] = c.b;
								pDst_pixels[3 + 4 * x] = c.a;
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint32_t);
						}

						break;
					}
					case block_format::cRGB565:
					case block_format::cBGR565:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = (fmt == block_format::cRGB565) ? static_cast<uint16_t>((mul_8(c.r, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.b, 31)) :
									static_cast<uint16_t>((mul_8(c.b, 31) << 11) | (mul_8(c.g, 63) << 5) | mul_8(c.r, 31));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}

						break;
					}
					case block_format::cRGBA4444:
					{
						color32 block_pixels[4][4];
						status = unpack_uastc(*pSource_block, (color32*)block_pixels, false);

						assert(sizeof(uint16_t) == output_block_or_pixel_stride_in_bytes);
						uint8_t* pDst_pixels = static_cast<uint8_t*>(pDst_blocks) + (block_x * 4 + block_y * 4 * output_row_pitch_in_blocks_or_pixels) * sizeof(uint16_t);

						const uint32_t max_x = basisu::minimum<int>(4, (int)output_row_pitch_in_blocks_or_pixels - (int)block_x * 4);
						const uint32_t max_y = basisu::minimum<int>(4, (int)output_rows_in_pixels - (int)block_y * 4);

						for (uint32_t y = 0; y < max_y; y++)
						{
							for (uint32_t x = 0; x < max_x; x++)
							{
								const color32& c = block_pixels[y][x];

								const uint16_t packed = static_cast<uint16_t>((mul_8(c.r, 15) << 12) | (mul_8(c.g, 15) << 8) | (mul_8(c.b, 15) << 4) | mul_8(c.a, 15));

								pDst_pixels[x * 2 + 0] = (uint8_t)(packed & 0xFF);
								pDst_pixels[x * 2 + 1] = (uint8_t)((packed >> 8) & 0xFF);
							}

							pDst_pixels += output_row_pitch_in_blocks_or_pixels * sizeof(uint16_t);
						}
						break;
					}
					default:
						assert(0);
						break;

					}

					if (!status)
					{
						BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: Transcoder failed to unpack a UASTC block - this is a bug, or the data was corrupted\n");
						return false;
					}

				} // block_x

			} // block_y
		}

		return true;
#else
		BASISU_DEVEL_ERROR("basisu_lowlevel_uastc_transcoder::transcode_slice: UASTC is unsupported\n");

		BASISU_NOTE_UNUSED(decode_flags);
		BASISU_NOTE_UNUSED(channel0);
		BASISU_NOTE_UNUSED(channel1);
		BASISU_NOTE_UNUSED(output_rows_in_pixels);
		BASISU_NOTE_UNUSED(output_row_pitch_in_blocks_or_pixels);
		BASISU_NOTE_UNUSED(output_block_or_pixel_stride_in_bytes);
		BASISU_NOTE_UNUSED(fmt);
		BASISU_NOTE_UNUSED(image_data_size);
		BASISU_NOTE_UNUSED(pImage_data);
		BASISU_NOTE_UNUSED(num_blocks_x);
		BASISU_NOTE_UNUSED(num_blocks_y);
		BASISU_NOTE_UNUSED(pDst_blocks);

		return false;
#endif
	}